

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cc
# Opt level: O0

void brotli::ConvertBitDepthsToSymbols(uint8_t *depth,size_t len,uint16_t *bits)

{
  byte bVar1;
  short sVar2;
  uint16_t uVar3;
  ulong local_88;
  size_t i_1;
  int bits_1;
  int code;
  uint16_t next_code [16];
  ulong local_50;
  size_t i;
  uint16_t bl_count [16];
  int kMaxBits;
  uint16_t *bits_local;
  size_t len_local;
  uint8_t *depth_local;
  
  bl_count[0xe] = 0x10;
  bl_count[0xf] = 0;
  memset(&i,0,0x20);
  for (local_50 = 0; local_50 < len; local_50 = local_50 + 1) {
    bl_count[(ulong)depth[local_50] - 4] = bl_count[(ulong)depth[local_50] - 4] + 1;
  }
  i._0_2_ = 0;
  bits_1._0_2_ = 0;
  sVar2 = 0;
  for (i_1._0_4_ = 1; (int)i_1 < 0x10; i_1._0_4_ = (int)i_1 + 1) {
    sVar2 = (sVar2 + bl_count[(long)((int)i_1 + -1) + -4]) * 2;
    *(short *)((long)&bits_1 + (long)(int)i_1 * 2) = sVar2;
  }
  for (local_88 = 0; local_88 < len; local_88 = local_88 + 1) {
    if (depth[local_88] != '\0') {
      bVar1 = depth[local_88];
      uVar3 = *(uint16_t *)((long)&bits_1 + (ulong)depth[local_88] * 2);
      *(uint16_t *)((long)&bits_1 + (ulong)depth[local_88] * 2) = uVar3 + 1;
      uVar3 = anon_unknown_0::ReverseBits((uint)bVar1,uVar3);
      bits[local_88] = uVar3;
    }
  }
  return;
}

Assistant:

void ConvertBitDepthsToSymbols(const uint8_t *depth,
                               size_t len,
                               uint16_t *bits) {
  // In Brotli, all bit depths are [1..15]
  // 0 bit depth means that the symbol does not exist.
  const int kMaxBits = 16;  // 0..15 are values for bits
  uint16_t bl_count[kMaxBits] = { 0 };
  {
    for (size_t i = 0; i < len; ++i) {
      ++bl_count[depth[i]];
    }
    bl_count[0] = 0;
  }
  uint16_t next_code[kMaxBits];
  next_code[0] = 0;
  {
    int code = 0;
    for (int bits = 1; bits < kMaxBits; ++bits) {
      code = (code + bl_count[bits - 1]) << 1;
      next_code[bits] = static_cast<uint16_t>(code);
    }
  }
  for (size_t i = 0; i < len; ++i) {
    if (depth[i]) {
      bits[i] = ReverseBits(depth[i], next_code[depth[i]]++);
    }
  }
}